

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

BinaryOp wasm::Abstract::getBinary(Type type,Op op)

{
  ulong uVar1;
  undefined *puVar2;
  
  switch(type.id) {
  case 0:
  case 1:
  case 6:
    break;
  case 2:
    if (op - Add < 0x1b) {
      uVar1 = (ulong)(op - Add);
      puVar2 = &DAT_00dd24c0;
LAB_0082a15f:
      return *(BinaryOp *)(puVar2 + uVar1 * 4);
    }
    break;
  case 3:
    if (op - Add < 0x1b) {
      uVar1 = (ulong)(op - Add);
      puVar2 = &DAT_00dd252c;
      goto LAB_0082a15f;
    }
    break;
  case 4:
    if (op - Add < 0x13) {
      uVar1 = (ulong)(op - Add);
      puVar2 = &DAT_00dd2598;
      goto LAB_0082a15f;
    }
    break;
  case 5:
    if (op - Add < 0x13) {
      uVar1 = (ulong)(op - Add);
      puVar2 = &DAT_00dd25e4;
      goto LAB_0082a15f;
    }
    break;
  default:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  return InvalidBinary;
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }